

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_error_case(void)

{
  malloc_mock p_Var1;
  long lVar2;
  int *piVar3;
  char *dup;
  undefined8 local_40;
  mmk_result local_38;
  mmk_mock_options local_14;
  malloc_mock local_10;
  malloc_mock mock;
  
  local_14 = (mmk_mock_options)((uint)local_14 & 0xfffffffc | 1);
  local_10 = mmkuser_malloc_mock_create("malloc@lib:strdup",local_14);
  if (local_10 == (malloc_mock)0x0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/sample/strdup/test.c"
                ,0x23,"(mmk_fn) mock != MMK_MOCK_INVALID");
    mmk_abort();
  }
  mmk_matcher_init(0);
  local_38.sentinel_ = 0;
  local_38.then_errno = 0xc;
  local_40 = 0;
  local_38.then_return = &local_40;
  local_38.then_call = (_func_void *)0x0;
  local_38.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_38);
  p_Var1 = local_10;
  mmk_matcher_add(MMK_MATCHER_ANY,1);
  (*p_Var1)(0);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/sample/strdup/test.c"
                      ,0x27);
  mmk_matcher_term();
  lVar2 = my_strdup("foo");
  if (lVar2 == 0) {
    piVar3 = __errno_location();
    if (*piVar3 == 0xc) goto LAB_00102533;
  }
  mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/sample/strdup/test.c"
              ,0x2a,"dup == NULL && errno == ENOMEM");
  mmk_abort();
LAB_00102533:
  mmk_reset((mmk_fn)local_10);
  return;
}

Assistant:

void test_error_case(void)
{
    /* Alternative usage */
    malloc_mock mock = mmk_mock("malloc@lib:strdup", malloc_mock);
    mmk_assert((mmk_fn) mock != MMK_MOCK_INVALID);

    mmk_when(mock(mmk_any(size_t)),
            .then_return = &(void *) { NULL },
            .then_errno = ENOMEM);

    char *dup = my_strdup("foo");
    mmk_assert(dup == NULL && errno == ENOMEM);

    mmk_reset(mock);
}